

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

void __thiscall ncnn::MultiHeadAttention::MultiHeadAttention(MultiHeadAttention *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_fffffffffffffdf0;
  
  Layer::Layer(in_stack_fffffffffffffdf0);
  *in_RDI = &PTR__MultiHeadAttention_0201d340;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  *(undefined4 *)(in_RDI + 0x21) = 0;
  in_RDI[0x22] = 0;
  *(undefined4 *)(in_RDI + 0x23) = 0;
  *(undefined4 *)((long)in_RDI + 0x11c) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined4 *)((long)in_RDI + 0x124) = 0;
  *(undefined4 *)(in_RDI + 0x25) = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  in_RDI[0x2b] = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)((long)in_RDI + 0x164) = 0;
  *(undefined4 *)(in_RDI + 0x2d) = 0;
  *(undefined4 *)((long)in_RDI + 0x16c) = 0;
  *(undefined4 *)(in_RDI + 0x2e) = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  in_RDI[0x32] = 0;
  *(undefined4 *)(in_RDI + 0x33) = 0;
  in_RDI[0x34] = 0;
  *(undefined4 *)(in_RDI + 0x35) = 0;
  *(undefined4 *)((long)in_RDI + 0x1ac) = 0;
  *(undefined4 *)(in_RDI + 0x36) = 0;
  *(undefined4 *)((long)in_RDI + 0x1b4) = 0;
  *(undefined4 *)(in_RDI + 0x37) = 0;
  in_RDI[0x38] = 0;
  in_RDI[0x39] = 0;
  in_RDI[0x3a] = 0;
  in_RDI[0x3b] = 0;
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  in_RDI[0x3d] = 0;
  *(undefined4 *)(in_RDI + 0x3e) = 0;
  *(undefined4 *)((long)in_RDI + 500) = 0;
  *(undefined4 *)(in_RDI + 0x3f) = 0;
  *(undefined4 *)((long)in_RDI + 0x1fc) = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  in_RDI[0x41] = 0;
  in_RDI[0x42] = 0;
  in_RDI[0x43] = 0;
  in_RDI[0x44] = 0;
  *(undefined4 *)(in_RDI + 0x45) = 0;
  in_RDI[0x46] = 0;
  *(undefined4 *)(in_RDI + 0x47) = 0;
  *(undefined4 *)((long)in_RDI + 0x23c) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)((long)in_RDI + 0x244) = 0;
  *(undefined4 *)(in_RDI + 0x49) = 0;
  in_RDI[0x4a] = 0;
  in_RDI[0x4b] = 0;
  in_RDI[0x4c] = 0;
  in_RDI[0x4d] = 0;
  *(undefined4 *)(in_RDI + 0x4e) = 0;
  in_RDI[0x4f] = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)((long)in_RDI + 0x284) = 0;
  *(undefined4 *)(in_RDI + 0x51) = 0;
  *(undefined4 *)((long)in_RDI + 0x28c) = 0;
  *(undefined4 *)(in_RDI + 0x52) = 0;
  in_RDI[0x53] = 0;
  in_RDI[0x54] = 0;
  in_RDI[0x55] = 0;
  in_RDI[0x56] = 0;
  *(undefined4 *)(in_RDI + 0x57) = 0;
  in_RDI[0x58] = 0;
  *(undefined4 *)(in_RDI + 0x59) = 0;
  *(undefined4 *)((long)in_RDI + 0x2cc) = 0;
  *(undefined4 *)(in_RDI + 0x5a) = 0;
  *(undefined4 *)((long)in_RDI + 0x2d4) = 0;
  *(undefined4 *)(in_RDI + 0x5b) = 0;
  in_RDI[0x5c] = 0;
  in_RDI[0x5d] = 0;
  in_RDI[0x5e] = 0;
  in_RDI[0x5f] = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  in_RDI[0x61] = 0;
  *(undefined4 *)(in_RDI + 0x62) = 0;
  *(undefined4 *)((long)in_RDI + 0x314) = 0;
  *(undefined4 *)(in_RDI + 99) = 0;
  *(undefined4 *)((long)in_RDI + 0x31c) = 0;
  *(undefined4 *)(in_RDI + 100) = 0;
  in_RDI[0x65] = 0;
  in_RDI[0x66] = 0;
  in_RDI[0x67] = 0;
  in_RDI[0x68] = 0;
  *(undefined4 *)(in_RDI + 0x69) = 0;
  in_RDI[0x6a] = 0;
  *(undefined4 *)(in_RDI + 0x6b) = 0;
  *(undefined4 *)((long)in_RDI + 0x35c) = 0;
  *(undefined4 *)(in_RDI + 0x6c) = 0;
  *(undefined4 *)((long)in_RDI + 0x364) = 0;
  *(undefined4 *)(in_RDI + 0x6d) = 0;
  in_RDI[0x6e] = 0;
  in_RDI[0x6f] = 0;
  in_RDI[0x70] = 0;
  in_RDI[0x71] = 0;
  *(undefined4 *)(in_RDI + 0x72) = 0;
  in_RDI[0x73] = 0;
  *(undefined4 *)(in_RDI + 0x74) = 0;
  *(undefined4 *)((long)in_RDI + 0x3a4) = 0;
  *(undefined4 *)(in_RDI + 0x75) = 0;
  *(undefined4 *)((long)in_RDI + 0x3ac) = 0;
  *(undefined4 *)(in_RDI + 0x76) = 0;
  in_RDI[0x77] = 0;
  in_RDI[0x78] = 0;
  in_RDI[0x79] = 0;
  in_RDI[0x7a] = 0;
  *(undefined4 *)(in_RDI + 0x7b) = 0;
  in_RDI[0x7c] = 0;
  *(undefined4 *)(in_RDI + 0x7d) = 0;
  *(undefined4 *)((long)in_RDI + 0x3ec) = 0;
  *(undefined4 *)(in_RDI + 0x7e) = 0;
  *(undefined4 *)((long)in_RDI + 0x3f4) = 0;
  *(undefined4 *)(in_RDI + 0x7f) = 0;
  in_RDI[0x80] = 0;
  return;
}

Assistant:

MultiHeadAttention::MultiHeadAttention()
{
}